

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

KinDynComputations * __thiscall
iDynTree::KinDynComputations::getCentroidalAverageVelocity(KinDynComputations *this)

{
  Position *pPVar1;
  Rotation *pRVar2;
  KinDynComputations *in_RSI;
  Position vectorFromComToBaseWithRotationOfBase;
  Transform newOutputFrame_X_oldOutputFrame;
  SpatialMomentum base_momentum;
  Twist base_averageVelocity;
  Position local_1b0 [24];
  SpatialMomentum local_198;
  Rotation local_138 [72];
  Transform local_f0 [56];
  Transform local_b8 [96];
  Transform local_58 [48];
  
  computeRawMassMatrixAndTotalMomentum(in_RSI);
  KinDynComputationsPrivateAttributes::getRobotLockedInertia(in_RSI->pimpl);
  iDynTree::FreeFloatingPos::worldBasePos();
  iDynTree::Transform::inverse();
  iDynTree::Transform::operator*(local_f0,&local_198);
  iDynTree::SpatialInertia::applyInverse((SpatialMomentum *)(local_b8 + 0x60));
  KinDynComputationsPrivateAttributes::getRobotLockedInertia(in_RSI->pimpl);
  iDynTree::SpatialInertia::getCenterOfMass();
  iDynTree::Position::inverse(local_1b0);
  iDynTree::Transform::Transform((Transform *)&local_198);
  if (in_RSI->pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
    iDynTree::Rotation::Identity();
    iDynTree::Transform::Transform(local_b8,local_138,local_1b0);
    iDynTree::Transform::operator=((Transform *)&local_198,local_b8);
  }
  else {
    iDynTree::FreeFloatingPos::worldBasePos();
    pPVar1 = (Position *)iDynTree::Transform::getRotation();
    iDynTree::FreeFloatingPos::worldBasePos();
    pRVar2 = (Rotation *)iDynTree::Transform::getRotation();
    iDynTree::Rotation::operator*(local_138,pPVar1);
    iDynTree::Transform::Transform(local_b8,pRVar2,(Position *)local_138);
    iDynTree::Transform::operator=((Transform *)&local_198,local_b8);
  }
  iDynTree::Transform::operator*((Transform *)this,(Twist *)&local_198);
  iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_f0);
  return this;
}

Assistant:

Twist KinDynComputations::getCentroidalAverageVelocity()
{
    this->computeRawMassMatrixAndTotalMomentum();

    const SpatialInertia & base_lockedInertia = pimpl->getRobotLockedInertia();
    SpatialMomentum base_momentum = pimpl->m_pos.worldBasePos().inverse()*pimpl->m_totalMomentum;
    Twist           base_averageVelocity = base_lockedInertia.applyInverse(base_momentum);

    // Get the center of mass in the base frame
    Position vectorFromComToBaseWithRotationOfBase = Position::inverse(pimpl->getRobotLockedInertia().getCenterOfMass());

    Transform newOutputFrame_X_oldOutputFrame;
    if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        // oldOutputFrame is B
        // newOutputFrame is G[B]

        newOutputFrame_X_oldOutputFrame =  Transform(Rotation::Identity(),vectorFromComToBaseWithRotationOfBase);
    }
    else
    {
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION ||
               pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        // oldOutputFrame is B
        // newOutputFrame is G[A]
        const Rotation & A_R_B = pimpl->m_pos.worldBasePos().getRotation();
        newOutputFrame_X_oldOutputFrame = Transform(pimpl->m_pos.worldBasePos().getRotation(),A_R_B*(vectorFromComToBaseWithRotationOfBase));
    }

    return newOutputFrame_X_oldOutputFrame*base_averageVelocity;
}